

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drawing.cpp
# Opt level: O3

int get_layer_order(vector<int,_std::allocator<int>_> *layers,
                   map<int,_layer_data,_std::less<int>,_std::allocator<std::pair<const_int,_layer_data>_>_>
                   *layer_info)

{
  _Rb_tree_color _Var1;
  _Rb_tree_color *p_Var2;
  _Rb_tree_node_base *p_Var3;
  long lVar4;
  _Self __tmp;
  mapped_type *pmVar5;
  ulong uVar6;
  _Rb_tree_node_base *p_Var7;
  _Rb_tree_header *p_Var8;
  pointer piVar9;
  pointer __k;
  _Rb_tree_color *p_Var10;
  
  __k = (layers->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_start;
  piVar9 = (layers->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  if (__k != piVar9) {
    do {
      pmVar5 = std::
               map<int,_layer_data,_std::less<int>,_std::allocator<std::pair<const_int,_layer_data>_>_>
               ::operator[](layer_info,__k);
      *__k = pmVar5->order;
      __k = __k + 1;
      piVar9 = (layers->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    } while (__k != piVar9);
    __k = (layers->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_start;
  }
  if (__k != piVar9) {
    uVar6 = (long)piVar9 - (long)__k >> 2;
    lVar4 = 0x3f;
    if (uVar6 != 0) {
      for (; uVar6 >> lVar4 == 0; lVar4 = lVar4 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (__k,piVar9,((uint)lVar4 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (__k,piVar9);
    p_Var10 = (_Rb_tree_color *)
              (layers->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start;
    p_Var2 = (_Rb_tree_color *)
             (layers->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_finish;
    if (p_Var10 != p_Var2) {
      p_Var3 = (layer_info->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var8 = &(layer_info->_M_t)._M_impl.super__Rb_tree_header;
      do {
        if ((_Rb_tree_header *)p_Var3 != p_Var8) {
          _Var1 = *p_Var10;
          p_Var7 = p_Var3;
          do {
            if (*(_Rb_tree_color *)((long)&p_Var7[2]._M_parent + 4) == _Var1) {
              *p_Var10 = p_Var7[1]._M_color;
              break;
            }
            p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
          } while ((_Rb_tree_header *)p_Var7 != p_Var8);
        }
        p_Var10 = p_Var10 + 1;
      } while (p_Var10 != p_Var2);
    }
  }
  return 0;
}

Assistant:

int get_layer_order(vector<int> &layers, map<int, layer_data> &layer_info)
{
  // Translate layer numbers to order
  auto layer_it = layers.begin();
  while (layer_it != layers.end())
  {
    // int order = layer_info[*layer_it].order;
    *layer_it = layer_info[*layer_it].order;
    layer_it++;
  }
  sort(layers.begin(), layers.end());
  // Translate back to layer
  layer_it = layers.begin();
  while (layer_it != layers.end())
  {
    // search through map for matching order
    auto ldf_iter = layer_info.begin();
    while (ldf_iter != layer_info.end())
    {
      if (ldf_iter->second.order == *layer_it)
      {
        *layer_it = ldf_iter->first;
        ldf_iter = layer_info.end();
      }
      else
      {
        ldf_iter++;
      }
    }
    layer_it++;
  }
  return EXIT_SUCCESS;
}